

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O2

void __thiscall
amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
operator()(PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
           *this,MultiFab *mf,int icomp,int ncomp,IntVect *nghost,Real time,int bccomp)

{
  int *piVar1;
  FArrayBox *dest;
  undefined8 uVar2;
  bool bVar3;
  int i;
  IndexType IVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  IndexType IVar9;
  Box bx;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcrs;
  MFIter mfi;
  Box local_4c;
  
  if ((((this->m_geom).super_CoordSys.field_0x51 != '\x01') ||
      ((this->m_geom).super_CoordSys.field_0x52 != '\x01')) ||
     ((this->m_geom).super_CoordSys.field_0x53 == '\0')) {
    IVar4 = BATransformer::index_type
                      (&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat);
    uVar2 = *(undefined8 *)(this->m_geom).domain.bigend.vect;
    bx.smallend.vect._0_8_ = *(undefined8 *)(this->m_geom).domain.smallend.vect;
    bx.smallend.vect[2] = (int)*(undefined8 *)((this->m_geom).domain.smallend.vect + 2);
    bx.bigend.vect[0] = (int)uVar2;
    bx.bigend.vect[1] = (int)((ulong)uVar2 >> 0x20);
    bx._20_8_ = *(undefined8 *)((this->m_geom).domain.bigend.vect + 2);
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      uVar8 = 1 << ((byte)lVar7 & 0x1f);
      uVar6 = (uint)lVar7;
      bx.bigend.vect[lVar7] =
           (bx.bigend.vect[lVar7] + (uint)((IVar4.itype >> (uVar6 & 0x1f) & 1) != 0)) -
           (uint)((bx.btype.itype >> (uVar6 & 0x1f) & 1) != 0);
      if ((IVar4.itype >> (uVar6 & 0x1f) & 1) == 0) {
        IVar9.itype = ~uVar8 & bx.btype.itype;
      }
      else {
        IVar9.itype = uVar8 | bx.btype.itype;
      }
      bx.btype.itype = IVar9.itype;
    }
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      if (*(char *)((long)(this->m_geom).super_CoordSys.inv_dx + lVar7 + 0x19) == '\x01') {
        iVar5 = nghost->vect[lVar7];
        piVar1 = bx.smallend.vect + lVar7;
        *piVar1 = *piVar1 - iVar5;
        piVar1 = bx.bigend.vect + lVar7;
        *piVar1 = *piVar1 + iVar5;
      }
    }
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              (&bcrs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)ncomp,
               (allocator_type *)&mfi);
    MFIter::MFIter(&mfi,(FabArrayBase *)mf,'\0');
    while( true ) {
      if (mfi.endIndex <= mfi.currentIndex) break;
      iVar5 = mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar5 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[mfi.currentIndex];
      }
      dest = (mf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar5];
      MFIter::fabbox(&local_4c,&mfi);
      bVar3 = Box::contains(&bx,&local_4c);
      if (!bVar3) {
        setBC(&local_4c,&(this->m_geom).domain,bccomp,0,ncomp,&this->m_bcr,&bcrs);
        GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::operator()
                  ((GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *)
                   &this->field_0xe0,&local_4c,dest,icomp,ncomp,&this->m_geom,time,&bcrs,0,bccomp);
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
              ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bcrs);
  }
  return;
}

Assistant:

void operator() (MultiFab& mf, int icomp, int ncomp, IntVect const& nghost,
                     Real time, int bccomp)
    {
        if (m_geom.isAllPeriodic()) return;

        BL_PROFILE("PhysBCFunct::()");

        //! create a grown domain box containing valid + periodic cells
        const Box& domain = m_geom.Domain();
        Box gdomain = amrex::convert(domain, mf.boxArray().ixType());
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            if (m_geom.isPeriodic(i)) {
                gdomain.grow(i, nghost[i]);
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        {
            Vector<BCRec> bcrs(ncomp);
            for (MFIter mfi(mf); mfi.isValid(); ++mfi)
            {
                FArrayBox& dest = mf[mfi];
                const Box& bx = mfi.fabbox();

                //! if there are cells not in the valid + periodic grown box
                //! we need to fill them here
                //!
                if (!gdomain.contains(bx))
                {
                    //! Based on BCRec for the domain, we need to make BCRec for this Box
                    amrex::setBC(bx, domain, bccomp, 0, ncomp, m_bcr, bcrs);

                    //! Note that we pass 0 as starting component of bcrs.
                    m_f(bx, dest, icomp, ncomp, m_geom, time, bcrs, 0, bccomp);
                }
            }
        }
    }